

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

double inspherefast(double *pa,double *pb,double *pc,double *pd,double *pe)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  dVar15 = *pe;
  dVar4 = pe[1];
  dVar13 = *pa - dVar15;
  dVar3 = *pb - dVar15;
  dVar8 = *pc - dVar15;
  dVar15 = *pd - dVar15;
  dVar17 = pa[1] - dVar4;
  dVar14 = pb[1] - dVar4;
  dVar11 = pc[1] - dVar4;
  dVar4 = pd[1] - dVar4;
  dVar1 = pe[2];
  dVar5 = pa[2] - dVar1;
  dVar7 = pb[2] - dVar1;
  dVar9 = pc[2] - dVar1;
  dVar1 = pd[2] - dVar1;
  dVar12 = dVar13 * dVar14 - dVar17 * dVar3;
  dVar18 = dVar3 * dVar11 - dVar14 * dVar8;
  dVar16 = dVar8 * dVar4 - dVar11 * dVar15;
  dVar6 = dVar15 * dVar17 - dVar4 * dVar13;
  dVar2 = dVar13 * dVar11 - dVar17 * dVar8;
  dVar10 = dVar3 * dVar4 - dVar14 * dVar15;
  return ((dVar1 * dVar1 + dVar15 * dVar15 + dVar4 * dVar4) *
          (dVar9 * dVar12 + (dVar5 * dVar18 - dVar2 * dVar7)) -
         (dVar9 * dVar9 + dVar8 * dVar8 + dVar11 * dVar11) *
         (dVar6 * dVar7 + dVar12 * dVar1 + dVar10 * dVar5)) +
         ((dVar7 * dVar7 + dVar3 * dVar3 + dVar14 * dVar14) *
          (dVar16 * dVar5 + dVar9 * dVar6 + dVar2 * dVar1) -
         (dVar5 * dVar5 + dVar13 * dVar13 + dVar17 * dVar17) *
         (dVar18 * dVar1 + (dVar7 * dVar16 - dVar10 * dVar9)));
}

Assistant:

REAL inspherefast(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL *pe)
{
  REAL aex, bex, cex, dex;
  REAL aey, bey, cey, dey;
  REAL aez, bez, cez, dez;
  REAL alift, blift, clift, dlift;
  REAL ab, bc, cd, da, ac, bd;
  REAL abc, bcd, cda, dab;

  aex = pa[0] - pe[0];
  bex = pb[0] - pe[0];
  cex = pc[0] - pe[0];
  dex = pd[0] - pe[0];
  aey = pa[1] - pe[1];
  bey = pb[1] - pe[1];
  cey = pc[1] - pe[1];
  dey = pd[1] - pe[1];
  aez = pa[2] - pe[2];
  bez = pb[2] - pe[2];
  cez = pc[2] - pe[2];
  dez = pd[2] - pe[2];

  ab = aex * bey - bex * aey;
  bc = bex * cey - cex * bey;
  cd = cex * dey - dex * cey;
  da = dex * aey - aex * dey;

  ac = aex * cey - cex * aey;
  bd = bex * dey - dex * bey;

  abc = aez * bc - bez * ac + cez * ab;
  bcd = bez * cd - cez * bd + dez * bc;
  cda = cez * da + dez * ac + aez * cd;
  dab = dez * ab + aez * bd + bez * da;

  alift = aex * aex + aey * aey + aez * aez;
  blift = bex * bex + bey * bey + bez * bez;
  clift = cex * cex + cey * cey + cez * cez;
  dlift = dex * dex + dey * dey + dez * dez;

  return (dlift * abc - clift * dab) + (blift * cda - alift * bcd);
}